

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::DumbDirectoryDatabase::get_hash_list_for_resource_tag
          (DumbDirectoryDatabase *this,ResourceTag tag,size_t *hash_count,Hash *hashes)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  long lVar3;
  Hash *pHVar4;
  bool bVar5;
  
  uVar1 = this->seen_blobs[tag]._M_h._M_element_count;
  if (hashes == (Hash *)0x0) {
    *hash_count = uVar1;
    bVar5 = true;
  }
  else if (uVar1 == *hash_count) {
    pHVar4 = hashes;
    for (p_Var2 = this->seen_blobs[tag]._M_h._M_before_begin._M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      *pHVar4 = (Hash)p_Var2[1]._M_nxt;
      pHVar4 = pHVar4 + 1;
    }
    bVar5 = true;
    if (uVar1 != 0) {
      lVar3 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (hashes,hashes + uVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>
                (hashes,hashes + uVar1);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *hash_count, Hash *hashes) override
	{
		size_t size = seen_blobs[tag].size();
		if (hashes)
		{
			if (size != *hash_count)
				return false;
		}
		else
			*hash_count = size;

		if (hashes)
		{
			Hash *iter = hashes;
			for (auto &blob : seen_blobs[tag])
				*iter++ = blob;

			// Make replay more deterministic.
			sort(hashes, hashes + size);
		}
		return true;
	}